

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SmallVector.h
# Opt level: O1

void __thiscall
slang::SmallVectorBase<std::filesystem::__cxx11::path>::reallocateTo
          (SmallVectorBase<std::filesystem::__cxx11::path> *this,size_type newCapacity)

{
  pointer ppVar1;
  long lVar2;
  path *ctx;
  pointer __p;
  pointer this_00;
  
  ctx = (path *)newCapacity;
  ppVar1 = (pointer)operator_new(newCapacity * 0x28);
  if (this->len != 0) {
    __p = this->data_;
    lVar2 = this->len * 0x28;
    this_00 = ppVar1;
    do {
      ctx = __p;
      std::filesystem::__cxx11::path::path(this_00,__p);
      __p = __p + 1;
      this_00 = this_00 + 1;
      lVar2 = lVar2 + -0x28;
    } while (lVar2 != 0);
  }
  cleanup(this,(EVP_PKEY_CTX *)ctx);
  this->cap = newCapacity;
  this->data_ = ppVar1;
  return;
}

Assistant:

void reallocateTo(size_type newCapacity) {
        auto newData = (pointer)::operator new(newCapacity * sizeof(T));
        std::uninitialized_move(begin(), end(), newData);

        cleanup();
        cap = newCapacity;
        data_ = newData;
    }